

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-types.cpp
# Opt level: O0

void __thiscall
yactfr::internal::PseudoNamedDt::PseudoNamedDt
          (PseudoNamedDt *this,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *name,Up *pseudoDt,Up *attrs)

{
  unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_30;
  Up *local_28;
  Up *attrs_local;
  Up *pseudoDt_local;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *name_local;
  PseudoNamedDt *this_local;
  
  local_28 = attrs;
  attrs_local = (Up *)pseudoDt;
  pseudoDt_local = (Up *)name;
  name_local = (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::unique_ptr
            (&local_30,attrs);
  WithAttrsMixin::WithAttrsMixin(&this->super_WithAttrsMixin,&local_30);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            (&local_30);
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::optional(&this->_name,name);
  std::unique_ptr<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>::
  unique_ptr(&this->_pseudoDt,pseudoDt);
  return;
}

Assistant:

PseudoNamedDt::PseudoNamedDt(boost::optional<std::string> name, PseudoDt::Up pseudoDt,
                             MapItem::Up attrs) :
    WithAttrsMixin {std::move(attrs)},
    _name {std::move(name)},
    _pseudoDt {std::move(pseudoDt)}
{
}